

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::NewPlaceholderFile(DescriptorPool *this,string *name)

{
  FileDescriptor *pFVar1;
  MutexLockMaybe lock;
  MutexLockMaybe MStack_18;
  
  internal::MutexLockMaybe::MutexLockMaybe(&MStack_18,this->mutex_);
  pFVar1 = NewPlaceholderFileWithMutexHeld(this,name);
  internal::MutexLockMaybe::~MutexLockMaybe(&MStack_18);
  return pFVar1;
}

Assistant:

FileDescriptor* DescriptorPool::NewPlaceholderFile(
    const std::string& name) const {
  MutexLockMaybe lock(mutex_);
  return NewPlaceholderFileWithMutexHeld(name);
}